

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O2

void __thiscall hrvo::Simulator::~Simulator(Simulator *this)

{
  Agent *pAVar1;
  KdTree *this_00;
  pointer ppAVar2;
  pointer ppGVar3;
  
  pAVar1 = this->defaults_;
  if (pAVar1 != (Agent *)0x0) {
    Agent::~Agent(pAVar1);
  }
  operator_delete(pAVar1);
  this->defaults_ = (Agent *)0x0;
  this_00 = this->kdTree_;
  if (this_00 != (KdTree *)0x0) {
    KdTree::~KdTree(this_00);
  }
  operator_delete(this_00);
  this->kdTree_ = (KdTree *)0x0;
  for (ppAVar2 = (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppAVar2 !=
      (this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppAVar2 = ppAVar2 + 1) {
    pAVar1 = *ppAVar2;
    if (pAVar1 != (Agent *)0x0) {
      Agent::~Agent(pAVar1);
    }
    operator_delete(pAVar1);
    *ppAVar2 = (Agent *)0x0;
  }
  for (ppGVar3 = (this->goals_).super__Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppGVar3 !=
      (this->goals_).super__Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppGVar3 = ppGVar3 + 1) {
    operator_delete(*ppGVar3);
    *ppGVar3 = (Goal *)0x0;
  }
  std::_Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>::~_Vector_base
            (&(this->goals_).super__Vector_base<hrvo::Goal_*,_std::allocator<hrvo::Goal_*>_>);
  std::_Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>::~_Vector_base
            (&(this->agents_).super__Vector_base<hrvo::Agent_*,_std::allocator<hrvo::Agent_*>_>);
  return;
}

Assistant:

Simulator::~Simulator() {
  delete defaults_;
  defaults_ = NULL;

  delete kdTree_;
  kdTree_ = NULL;

  for (std::vector<Agent *>::iterator iter = agents_.begin();
       iter != agents_.end(); ++iter) {
    delete *iter;
    *iter = NULL;
  }

  for (std::vector<Goal *>::iterator iter = goals_.begin();
       iter != goals_.end(); ++iter) {
    delete *iter;
    *iter = NULL;
  }
}